

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

int SSL_parse_client_hello(SSL *ssl,SSL_CLIENT_HELLO *out,uint8_t *in,size_t len)

{
  bool bVar1;
  int iVar2;
  CBS cbs;
  CBS local_18;
  
  local_18.data = in;
  local_18.len = len;
  bVar1 = bssl::ssl_parse_client_hello_with_trailing_data(ssl,&local_18,out);
  iVar2 = 0;
  if (bVar1) {
    if (local_18.len == 0) {
      iVar2 = 1;
    }
    else {
      iVar2 = 0;
      ERR_put_error(0x10,0,0x83,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x129a);
    }
  }
  return iVar2;
}

Assistant:

int SSL_parse_client_hello(const SSL *ssl, SSL_CLIENT_HELLO *out,
                           const uint8_t *in, size_t len) {
  CBS cbs = Span(in, len);
  if (!ssl_parse_client_hello_with_trailing_data(ssl, &cbs, out)) {
    return 0;
  }
  if (CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CLIENTHELLO_PARSE_FAILED);
    return 0;
  }
  return 1;
}